

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::write_extra_code(Fl_Widget_Type *this)

{
  int iVar1;
  char *pcVar2;
  int n;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    if (this->extra_code_[lVar3] != (char *)0x0) {
      iVar1 = isdeclare(this->extra_code_[lVar3]);
      if (iVar1 == 0) {
        pcVar2 = indent();
        write_c("%s%s\n",pcVar2,this->extra_code_[lVar3]);
      }
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_extra_code() {
  for (int n=0; n < NUM_EXTRA_CODE; n++)
    if (extra_code(n) && !isdeclare(extra_code(n)))
      write_c("%s%s\n", indent(), extra_code(n));
}